

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

NamedPoint * helics::ValueConverter<helics::NamedPoint>::interpret(data_view *block)

{
  NamedPoint *in_RDI;
  NamedPoint *val;
  NamedPoint *val_00;
  byte *in_stack_ffffffffffffffd8;
  
  val_00 = in_RDI;
  NamedPoint::NamedPoint(in_RDI);
  data_view::bytes((data_view *)0x1d7f3e);
  helics::detail::convertFromBinary(in_stack_ffffffffffffffd8,val_00);
  return in_RDI;
}

Assistant:

static X interpret(const data_view& block)
    {
        X val;
        detail::convertFromBinary(block.bytes(), val);
        return val;
    }